

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_ret(FuncState *fs,int first,int nret)

{
  int nret_local;
  int first_local;
  FuncState *fs_local;
  
  luaK_codeABC(fs,OP_RETURN,first,nret + 1,0);
  return;
}

Assistant:

void luaK_ret (FuncState *fs, int first, int nret) {
  OpCode op;
  switch (nret) {
    case 0: op = OP_RETURN0; break;
    case 1: op = OP_RETURN1; break;
    default: op = OP_RETURN; break;
  }
  luaK_codeABC(fs, op, first, nret + 1, 0);
}